

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_encoding.cpp
# Opt level: O1

void ximu::PacketEncoding::rightShiftBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  byte *pbVar1;
  int iVar2;
  pointer puVar3;
  uint uVar4;
  long lVar5;
  
  puVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  pbVar1 = puVar3 + -1;
  *pbVar1 = *pbVar1 >> 1;
  uVar4 = ((int)puVar3 - iVar2) - 2;
  if (-1 < (int)uVar4) {
    lVar5 = (ulong)uVar4 + 1;
    do {
      puVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((puVar3[lVar5 + -1] & 1) != 0) {
        pbVar1 = puVar3 + lVar5;
        *pbVar1 = *pbVar1 | 0x80;
      }
      pbVar1 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar5 + -1;
      *pbVar1 = *pbVar1 >> 1;
      lVar5 = lVar5 + -1;
    } while (0 < (int)lVar5);
  }
  return;
}

Assistant:

void PacketEncoding::rightShiftBytes(std::vector<unsigned char>& v) {
  size_t size = v.size();
  v[size - 1] >>= 1;

  for (int idx = size - 2; idx >= 0; --idx) {
    if ((v[idx] & 0x01) == 0x01)
      v[idx + 1] |= 0x80;
    v[idx] >>= 1;
  }
}